

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

BoundLimitNode *
duckdb::BoundLimitNode::Deserialize
          (BoundLimitNode *__return_storage_ptr__,Deserializer *deserializer)

{
  LimitNodeType type;
  unsigned_long constant_integer;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  undefined1 local_38 [16];
  
  type = Deserializer::ReadProperty<duckdb::LimitNodeType>(deserializer,100,"type");
  constant_integer =
       Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,0x65,"constant_integer");
  local_38._8_8_ = Deserializer::ReadProperty<double>(deserializer,0x66,"constant_percentage");
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((Deserializer *)local_38,(field_id_t)deserializer,(char *)0x67);
  local_40._M_head_impl = (Expression *)local_38._0_8_;
  local_38._0_8_ = (_func_int **)0x0;
  BoundLimitNode(__return_storage_ptr__,type,constant_integer,(double)local_38._8_8_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_40);
  if (local_40._M_head_impl != (Expression *)0x0) {
    (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_40._M_head_impl = (Expression *)0x0;
  if ((_func_int **)local_38._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_38._0_8_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundLimitNode BoundLimitNode::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<LimitNodeType>(100, "type");
	auto constant_integer = deserializer.ReadPropertyWithDefault<idx_t>(101, "constant_integer");
	auto constant_percentage = deserializer.ReadProperty<double>(102, "constant_percentage");
	auto expression = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(103, "expression");
	BoundLimitNode result(type, constant_integer, constant_percentage, std::move(expression));
	return result;
}